

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartsWithTest.cpp
# Opt level: O3

void __thiscall
oout::StartsWithTest::StartsWithTest(StartsWithTest *this,shared_ptr<const_oout::Text> *a,string *b)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined1 local_49;
  MatchTest *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  shared_ptr<oout::StartsWithMatch> local_30;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__StartsWithTest_00198228;
  local_30.super___shared_ptr<oout::StartsWithMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::StartsWithMatch,std::allocator<oout::StartsWithMatch>,std::__cxx11::string_const&>
            (&local_30.super___shared_ptr<oout::StartsWithMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(StartsWithMatch **)&local_30,
             (allocator<oout::StartsWithMatch> *)&local_49,b);
  local_48 = (MatchTest *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::MatchTest,std::allocator<oout::MatchTest>,std::shared_ptr<oout::Text_const>const&,std::shared_ptr<oout::StartsWithMatch>>
            (a_Stack_40,&local_48,(allocator<oout::MatchTest> *)&local_49,a,&local_30);
  _Var1._M_pi = a_Stack_40[0]._M_pi;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->test).super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_48->super_Test;
  (this->test).super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  local_48 = (MatchTest *)0x0;
  if (local_30.super___shared_ptr<oout::StartsWithMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<oout::StartsWithMatch,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

StartsWithTest::StartsWithTest(const shared_ptr<const Text> &a, const string &b)
	: test(make_shared<MatchTest>(a, make_shared<StartsWithMatch>(b)))
{
}